

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# _PDCLIB_tzparse.c
# Opt level: O0

char * getsecs(char *strp,int_fast32_t *secsp)

{
  int local_24;
  int_fast32_t *piStack_20;
  int num;
  int_fast32_t *secsp_local;
  char *strp_local;
  
  piStack_20 = secsp;
  secsp_local = (int_fast32_t *)strp;
  secsp_local = (int_fast32_t *)getnum(strp,&local_24,0,0xa7);
  if (secsp_local == (int_fast32_t *)0x0) {
    strp_local = (char *)0x0;
  }
  else {
    *piStack_20 = local_24 * 0xe10;
    if ((char)*secsp_local == ':') {
      secsp_local = (int_fast32_t *)((long)secsp_local + 1);
      secsp_local = (int_fast32_t *)getnum((char *)secsp_local,&local_24,0,0x3b);
      if (secsp_local == (int_fast32_t *)0x0) {
        return (char *)0x0;
      }
      *piStack_20 = local_24 * 0x3c + *piStack_20;
      if ((char)*secsp_local == ':') {
        secsp_local = (int_fast32_t *)((long)secsp_local + 1);
        secsp_local = (int_fast32_t *)getnum((char *)secsp_local,&local_24,0,0x3c);
        if (secsp_local == (int_fast32_t *)0x0) {
          return (char *)0x0;
        }
        *piStack_20 = local_24 + *piStack_20;
      }
    }
    strp_local = (char *)secsp_local;
  }
  return strp_local;
}

Assistant:

static const char * getsecs( const char * strp, int_fast32_t * secsp )
{
    int num;

    /* 'HOURSPERDAY * DAYSPERWEEK - 1' allows quasi-Posix rules like
       "M10.4.6/26", which does not conform to Posix,
       but which specifies the equivalent of
       "02:00 on the first Sunday on or after 23 Oct".
    */
    strp = getnum( strp, &num, 0, HOURSPERDAY * DAYSPERWEEK - 1 );

    if ( strp == NULL )
    {
        return NULL;
    }

    *secsp = num * (int_fast32_t) SECSPERHOUR;

    if ( *strp == ':' )
    {
        ++strp;
        strp = getnum( strp, &num, 0, MINSPERHOUR - 1 );

        if ( strp == NULL )
        {
            return NULL;
        }

        *secsp += num * SECSPERMIN;

        if ( *strp == ':' )
        {
            ++strp;
            /* 'SECSPERMIN' allows for leap seconds.  */
            strp = getnum( strp, &num, 0, SECSPERMIN );

            if ( strp == NULL )
            {
                return NULL;
            }

            *secsp += num;
        }
    }

    return strp;
}